

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O0

vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *
dg::getCalledFunctions(Value *calledValue,LLVMPointerAnalysis *PTA)

{
  bool bVar1;
  ret_type this;
  long *in_RDX;
  undefined8 in_RSI;
  Value *in_RDI;
  undefined1 auVar2 [16];
  Function *F;
  LLVMPointer *llvmptr;
  const_iterator __end1;
  const_iterator __begin1;
  LLVMPointsToSet *__range1;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *functions;
  LLVMPointsToSet *in_stack_ffffffffffffff88;
  Value *__x;
  undefined1 local_58 [16];
  undefined1 *local_48;
  LLVMPointsToSetImpl *local_40;
  LLVMPointsToSetImpl *local_38;
  undefined1 local_30 [8];
  undefined1 *local_28;
  undefined1 local_19;
  long *local_18;
  undefined8 local_10;
  
  local_19 = 0;
  __x = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::vector
            ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)0x1974ea);
  (**(code **)(*local_18 + 8))(local_30,local_18,local_10);
  local_28 = local_30;
  local_38 = (LLVMPointsToSetImpl *)LLVMPointsToSet::begin(in_stack_ffffffffffffff88);
  local_40 = (LLVMPointsToSetImpl *)LLVMPointsToSet::end();
  while (bVar1 = LLVMPointsToSet::const_iterator::operator!=
                           ((const_iterator *)in_RDI,(const_iterator *)in_stack_ffffffffffffff88),
        bVar1) {
    auVar2 = LLVMPointsToSet::const_iterator::operator*((const_iterator *)0x19754b);
    local_48 = local_58;
    local_58 = auVar2;
    this = llvm::dyn_cast<llvm::Function,llvm::Value>(in_RDI);
    if (this != (ret_type)0x0) {
      std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::push_back
                ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)this,
                 (value_type *)__x);
    }
    LLVMPointsToSet::const_iterator::operator++((const_iterator *)in_RDI);
  }
  LLVMPointsToSet::~LLVMPointsToSet((LLVMPointsToSet *)0x19753f);
  return (vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)__x;
}

Assistant:

inline std::vector<const llvm::Function *>
getCalledFunctions(const llvm::Value *calledValue, LLVMPointerAnalysis *PTA) {
    std::vector<const llvm::Function *> functions;
    for (const auto &llvmptr : PTA->getLLVMPointsTo(calledValue)) {
        if (auto *const F = llvm::dyn_cast<llvm::Function>(llvmptr.value)) {
            functions.push_back(F);
        }
    }
    return functions;
}